

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

aim_t * __thiscall aim_t::Clone(aim_t *this)

{
  double dVar1;
  AActor *pAVar2;
  aim_t *cloned;
  aim_t *in_RDI;
  
  dVar1 = (this->aimtrace).Y;
  (in_RDI->aimtrace).X = (this->aimtrace).X;
  (in_RDI->aimtrace).Y = dVar1;
  in_RDI->aimtarget = this->aimtarget;
  dVar1 = this->attackrange;
  (in_RDI->aimpitch).Degrees = (this->aimpitch).Degrees;
  in_RDI->attackrange = dVar1;
  pAVar2 = this->friender;
  in_RDI->shootthing = this->shootthing;
  in_RDI->friender = pAVar2;
  in_RDI->shootz = this->shootz;
  in_RDI->unlinked = this->unlinked;
  in_RDI->flags = this->flags;
  return in_RDI;
}

Assistant:

aim_t Clone()
	{
		aim_t cloned;

		cloned.aimtrace = aimtrace;
		cloned.aimpitch = aimpitch;
		cloned.aimtarget = aimtarget;
		cloned.attackrange = attackrange;
		cloned.shootthing = shootthing;
		cloned.friender = friender;
		cloned.shootz = shootz;
		cloned.unlinked = unlinked;
		cloned.flags = flags;
		return cloned;
	}